

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_fast.cpp
# Opt level: O3

void crnlib::dxt_fast::find_representative_colors
               (uint n,color_quad_u8 *pBlock,color_quad_u8 *lo,color_quad_u8 *hi)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  bool bVar4;
  undefined1 uVar5;
  uint i;
  uint uVar6;
  long lVar7;
  undefined1 uVar8;
  uint uVar9;
  uint *puVar10;
  ulong uVar11;
  int iVar12;
  int iVar13;
  undefined1 uVar14;
  ulong uVar15;
  undefined1 uVar16;
  uint iter_index;
  int iVar17;
  long lVar18;
  bool bVar19;
  int iVar20;
  long lVar21;
  ulong uVar22;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 local_c0;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 local_bc;
  undefined2 local_b6;
  byte local_b4;
  undefined2 local_b3;
  byte local_b1;
  uint local_b0 [7];
  int local_94 [9];
  uint8 new_color8 [2] [3];
  uint weight [2];
  long lStack_60;
  undefined1 auStack_58 [12];
  uint ave [3];
  
  if (n == 0) {
    uVar11 = 0;
    lVar7 = 0;
    lVar18 = 0;
    lVar21 = 0;
  }
  else {
    uVar11 = (ulong)n;
    uVar15 = 0;
    lVar21 = 0;
    lVar18 = 0;
    lVar7 = 0;
    do {
      lVar7 = lVar7 + (ulong)pBlock[uVar15].field_0.field_0.r;
      lVar18 = lVar18 + (ulong)pBlock[uVar15].field_0.field_0.g;
      lVar21 = lVar21 + (ulong)pBlock[uVar15].field_0.field_0.b;
      uVar15 = uVar15 + 1;
    } while (uVar11 != uVar15);
  }
  uVar22 = (ulong)(n >> 1);
  uVar15 = 0;
  local_94[0] = (int)((lVar7 + uVar22) / uVar11);
  local_94[1] = (int)((lVar18 + uVar22) / uVar11);
  local_94[2] = (int)((lVar21 + uVar22) / uVar11);
  if (n != 0) {
    iVar17 = -1;
    uVar22 = 0;
    do {
      iVar13 = (uint)pBlock[uVar22].field_0.field_0.r - local_94[0];
      iVar20 = (uint)pBlock[uVar22].field_0.field_0.g - local_94[1];
      iVar12 = (uint)pBlock[uVar22].field_0.field_0.b - local_94[2];
      iVar12 = iVar12 * iVar12 + iVar20 * iVar20 + iVar13 * iVar13;
      if (iVar17 < iVar12) {
        uVar15 = uVar22 & 0xffffffff;
        iVar17 = iVar12;
      }
      uVar22 = uVar22 + 1;
    } while (uVar11 != uVar22);
  }
  uVar22 = 0;
  local_bc = (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)
             *(anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 *)
              &pBlock[uVar15].field_0.field_0;
  if (n != 0) {
    iVar17 = -1;
    uVar15 = 0;
    do {
      iVar13 = (uint)pBlock[uVar15].field_0.field_0.r - (local_bc.m_u32 & 0xff);
      iVar20 = (uint)pBlock[uVar15].field_0.field_0.g - (local_bc.m_u32 >> 8 & 0xff);
      iVar12 = (uint)pBlock[uVar15].field_0.field_0.b - (local_bc.m_u32 >> 0x10 & 0xff);
      iVar12 = iVar12 * iVar12 + iVar20 * iVar20 + iVar13 * iVar13;
      if (iVar17 < iVar12) {
        uVar22 = uVar15 & 0xffffffff;
        iVar17 = iVar12;
      }
      uVar15 = uVar15 + 1;
    } while (uVar11 != uVar15);
  }
  local_c0.field_0 =
       *(anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 *)
        &pBlock[uVar22].field_0.field_0;
  lVar7 = 0;
  do {
    iVar17 = local_94[lVar7];
    local_bc.c[lVar7] = (uchar)((uint)local_bc.c[lVar7] + iVar17 >> 1);
    local_c0.c[lVar7] = (uchar)((uint)local_c0.c[lVar7] + iVar17 >> 1);
    lVar7 = lVar7 + 1;
  } while (lVar7 != 3);
  iVar17 = 0;
  while( true ) {
    if ((local_bc.field_0.r == local_c0.field_0.r) &&
       (local_bc.field_0.b == local_c0.field_0.b && local_bc.field_0.g == local_c0.field_0.g))
    break;
    _weight = (undefined1  [16])0x0;
    _auStack_58 = (undefined1  [16])0x0;
    stack0xffffffffffffffb8 = (undefined1  [16])0x0;
    local_b0[0] = 0;
    local_b0[1] = 0;
    if (n == 0) break;
    iVar12 = (local_c0.m_u32 & 0xff) - (local_bc.m_u32 & 0xff);
    iVar13 = (uint)local_c0.field_0.b - (uint)local_bc.field_0.b;
    uVar15 = 0;
    do {
      bVar1 = pBlock[uVar15].field_0.field_0.r;
      bVar2 = pBlock[uVar15].field_0.field_0.g;
      bVar3 = pBlock[uVar15].field_0.field_0.b;
      uVar22 = (ulong)((int)(((local_c0.m_u32 & 0xff) + (local_bc.m_u32 & 0xff)) * iVar12 +
                             ((uint)local_bc.field_0.g + (uint)local_c0.field_0.g) *
                             ((uint)local_c0.field_0.g - (uint)local_bc.field_0.g) +
                            ((uint)local_bc.field_0.b + (uint)local_c0.field_0.b) * iVar13) <
                      (int)(iVar13 * 2 * (uint)bVar3 +
                           ((uint)local_c0.field_0.g - (uint)local_bc.field_0.g) * 2 * (uint)bVar2 +
                           iVar12 * 2 * (uint)bVar1));
      *(ulong *)(weight + uVar22 * 6) = *(long *)(weight + uVar22 * 6) + (ulong)bVar1;
      *(ulong *)(auStack_58 + uVar22 * 0x18 + -8) =
           *(long *)(auStack_58 + uVar22 * 0x18 + -8) + (ulong)bVar2;
      *(ulong *)(auStack_58 + uVar22 * 0x18) = *(long *)(auStack_58 + uVar22 * 0x18) + (ulong)bVar3;
      local_b0[uVar22] = local_b0[uVar22] + 1;
      uVar15 = uVar15 + 1;
    } while (uVar11 != uVar15);
    if ((local_b0[0] == 0) || (local_b0[1] == 0)) break;
    lVar7 = 0;
    puVar10 = local_b0;
    bVar4 = true;
    do {
      bVar19 = bVar4;
      uVar6 = *puVar10;
      lVar18 = 0;
      do {
        *(char *)((long)&local_b6 + lVar18 + lVar7 * 3) =
             (char)((*(long *)(weight + lVar7 * 6 + lVar18 * 2) + (ulong)(uVar6 >> 1)) /
                   (ulong)uVar6);
        lVar18 = lVar18 + 1;
      } while (lVar18 != 3);
      lVar7 = 1;
      puVar10 = local_b0 + 1;
      bVar4 = false;
    } while (bVar19);
    if (((((uchar)local_b6 == local_bc.field_0.r) && (local_b6._1_1_ == local_bc.field_0.g)) &&
        (local_b4 == local_bc.field_0.b)) &&
       ((((uchar)local_b3 == local_c0.field_0.r && (local_b3._1_1_ == local_c0.field_0.g)) &&
        (local_b1 == local_c0.field_0.b)))) break;
    local_bc.field_0.b = local_b4;
    local_bc.m_u32._0_2_ = local_b6;
    local_c0.field_0.b = local_b1;
    local_c0.m_u32._0_2_ = local_b3;
    iVar17 = iVar17 + 1;
    if (iVar17 == 4) break;
  }
  lVar7 = 0;
  uVar6 = 0;
  uVar9 = 0;
  do {
    uVar9 = uVar9 + (uint)local_bc.c[lVar7] * (uint)local_bc.c[lVar7];
    uVar6 = uVar6 + (uint)local_c0.c[lVar7] * (uint)local_c0.c[lVar7];
    lVar7 = lVar7 + 1;
  } while (lVar7 != 3);
  uVar16 = local_c0.field_0.r;
  uVar14 = local_c0.field_0.g;
  uVar8 = local_c0.field_0.b;
  uVar5 = local_c0.field_0.a;
  if (uVar6 < uVar9) {
    uVar16 = local_bc.field_0.r;
    local_bc.field_0.r = local_c0.field_0.r;
    uVar14 = local_bc.field_0.g;
    local_bc.field_0.g = local_c0.field_0.g;
    uVar8 = local_bc.field_0.b;
    local_bc.field_0.b = local_c0.field_0.b;
    uVar5 = local_bc.field_0.a;
    local_bc.field_0.a = local_c0.field_0.a;
  }
  (lo->field_0).field_0.r = local_bc.field_0.r;
  (lo->field_0).field_0.g = local_bc.field_0.g;
  (lo->field_0).field_0.b = local_bc.field_0.b;
  (lo->field_0).field_0.a = local_bc.field_0.a;
  (hi->field_0).field_0.r = uVar16;
  (hi->field_0).field_0.g = uVar14;
  (hi->field_0).field_0.b = uVar8;
  (hi->field_0).field_0.a = uVar5;
  return;
}

Assistant:

void find_representative_colors(uint n, const color_quad_u8* pBlock, color_quad_u8& lo, color_quad_u8& hi)
        {
            uint64 ave64[3];
            ave64[0] = 0;
            ave64[1] = 0;
            ave64[2] = 0;

            for (uint i = 0; i < n; i++)
            {
                ave64[0] += pBlock[i].r;
                ave64[1] += pBlock[i].g;
                ave64[2] += pBlock[i].b;
            }

            uint ave[3];
            ave[0] = static_cast<uint>((ave64[0] + (n / 2)) / n);
            ave[1] = static_cast<uint>((ave64[1] + (n / 2)) / n);
            ave[2] = static_cast<uint>((ave64[2] + (n / 2)) / n);

            int furthest_dist = -1;
            uint furthest_index = 0;
            for (uint i = 0; i < n; i++)
            {
                int r = pBlock[i].r - ave[0];
                int g = pBlock[i].g - ave[1];
                int b = pBlock[i].b - ave[2];
                int dist = r * r + g * g + b * b;
                if (dist > furthest_dist)
                {
                    furthest_dist = dist;
                    furthest_index = i;
                }
            }

            color_quad_u8 lo_color(pBlock[furthest_index]);

            int opp_dist = -1;
            uint opp_index = 0;
            for (uint i = 0; i < n; i++)
            {
                int r = pBlock[i].r - lo_color.r;
                int g = pBlock[i].g - lo_color.g;
                int b = pBlock[i].b - lo_color.b;
                int dist = r * r + g * g + b * b;
                if (dist > opp_dist)
                {
                    opp_dist = dist;
                    opp_index = i;
                }
            }

            color_quad_u8 hi_color(pBlock[opp_index]);

            for (uint i = 0; i < 3; i++)
            {
                lo_color[i] = static_cast<uint8>((lo_color[i] + ave[i]) >> 1);
                hi_color[i] = static_cast<uint8>((hi_color[i] + ave[i]) >> 1);
            }

            const uint cMaxIters = 4;
            for (uint iter_index = 0; iter_index < cMaxIters; iter_index++)
            {
                if ((lo_color[0] == hi_color[0]) && (lo_color[1] == hi_color[1]) && (lo_color[2] == hi_color[2]))
                {
                    break;
                }

                uint64 new_color[2][3];
                uint weight[2];

                utils::zero_object(new_color);
                utils::zero_object(weight);

                int vec_r = hi_color[0] - lo_color[0];
                int vec_g = hi_color[1] - lo_color[1];
                int vec_b = hi_color[2] - lo_color[2];

                int lo_dot = vec_r * lo_color[0] + vec_g * lo_color[1] + vec_b * lo_color[2];
                int hi_dot = vec_r * hi_color[0] + vec_g * hi_color[1] + vec_b * hi_color[2];
                int mid_dot = lo_dot + hi_dot;

                vec_r *= 2;
                vec_g *= 2;
                vec_b *= 2;

                for (uint i = 0; i < n; i++)
                {
                    const color_quad_u8& c = pBlock[i];

                    const int dot = c[0] * vec_r + c[1] * vec_g + c[2] * vec_b;
                    const uint match_index = (dot > mid_dot);

                    new_color[match_index][0] += c.r;
                    new_color[match_index][1] += c.g;
                    new_color[match_index][2] += c.b;
                    weight[match_index]++;
                }

                if ((!weight[0]) || (!weight[1]))
                {
                    break;
                }

                uint8 new_color8[2][3];

                for (uint j = 0; j < 2; j++)
                {
                    for (uint i = 0; i < 3; i++)
                    {
                        new_color8[j][i] = static_cast<uint8>((new_color[j][i] + (weight[j] / 2)) / weight[j]);
                    }
                }

                if ((new_color8[0][0] == lo_color[0]) && (new_color8[0][1] == lo_color[1]) && (new_color8[0][2] == lo_color[2]) &&
                    (new_color8[1][0] == hi_color[0]) && (new_color8[1][1] == hi_color[1]) && (new_color8[1][2] == hi_color[2]))
                {
                    break;
                }

                for (uint i = 0; i < 3; i++)
                {
                    lo_color[i] = new_color8[0][i];
                    hi_color[i] = new_color8[1][i];
                }
            }

            uint energy[2] = { 0, 0 };
            for (uint i = 0; i < 3; i++)
            {
                energy[0] += lo_color[i] * lo_color[i];
                energy[1] += hi_color[i] * hi_color[i];
            }

            if (energy[0] > energy[1])
            {
                std::swap(lo_color, hi_color);
            }

            lo = lo_color;
            hi = hi_color;
        }